

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O3

void __thiscall
directed_flag_complex_computer::reorder_edges_t::operator()
          (reorder_edges_t *this,vertex_index_t *first_vertex,int param_2)

{
  vector<float,std::allocator<float>> *this_00;
  vector<float,_std::allocator<float>_> *pvVar1;
  iterator __position;
  iterator iVar2;
  pointer puVar3;
  float *__args;
  iterator iVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_01;
  directed_flag_complex_cell_t cell;
  unsigned_short local_2a;
  key_type local_28;
  
  local_28._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_00154288;
  local_28.vertices = first_vertex;
  if (this->reorder_filtration == true) {
    this_00 = (vector<float,std::allocator<float>> *)this->new_filtration;
    pvVar1 = this->old_filtration;
    iVar2 = std::
            _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this->cell_hash,&local_28);
    __args = (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start +
             *(long *)((long)iVar2.
                             super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                             ._M_cur + 0x18);
    __position._M_current = *(float **)(this_00 + 8);
    if (__position._M_current == *(float **)(this_00 + 0x10)) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                (this_00,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      *(float **)(this_00 + 8) = __position._M_current + 1;
    }
  }
  this_01 = this->new_edges;
  local_2a = *local_28.vertices;
  iVar4._M_current =
       (this_01->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  puVar3 = (this_01->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == puVar3) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
              (this_01,iVar4,&local_2a);
    this_01 = this->new_edges;
    iVar4._M_current =
         (this_01->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (this_01->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_2a;
    iVar4._M_current = iVar4._M_current + 1;
    (this_01->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_2a = local_28.vertices[1];
  if (iVar4._M_current == puVar3) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
              (this_01,iVar4,&local_2a);
  }
  else {
    *iVar4._M_current = local_2a;
    (this_01->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int) {
		directed_flag_complex_cell_t cell(first_vertex);
		if (reorder_filtration) new_filtration.push_back(old_filtration[cell_hash.find(cell)->second]);
		new_edges.push_back(cell.vertex(0));
		new_edges.push_back(cell.vertex(1));
	}